

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int sort_5_4::shell_sort_1(int *a,int n,int gap)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  int local_28;
  int i;
  int t;
  int j;
  int g;
  int gap_local;
  int n_local;
  int *a_local;
  
  for (t = n / gap; 0 < t; t = t / gap) {
    for (local_28 = t; local_28 < n; local_28 = local_28 + 1) {
      iVar1 = a[local_28];
      i = local_28 - t;
      while( true ) {
        bVar2 = false;
        if (-1 < i) {
          bVar2 = iVar1 < a[i];
        }
        if (!bVar2) break;
        a[i + t] = a[i];
        i = i - t;
      }
      a[i + t] = iVar1;
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

int shell_sort_1(int *a, int n, int gap = 2) {
        int g = n / gap, j, t;
        while (g > 0) {
            for (int i = g; i < n; i++) {
                t = a[i];
                for (j = i - g; j >= 0 && a[j] > t; j -= g) {
                    a[j + g] = a[j];
                }
                a[j + g] = t;
            }
            g /= gap;
        }
    }